

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.cpp
# Opt level: O1

bool error_registers(int n,int regnumber)

{
  ostream *poVar1;
  
  if (regnumber <= n) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"<!> Overflow. Register \'",0x18);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,n);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' does not exist.",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return regnumber <= n;
}

Assistant:

bool error_registers(int n, int regnumber)
{

    if( n > ( regnumber - 1 ) )
    {
        std::cerr << "<!> Overflow. Register '" << n << "' does not exist." << std::endl;
        return true;
    }

    return false;

}